

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O3

BoundedType * __thiscall BoundedType::Get(BoundedType *this,int32_t max_val)

{
  _Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false> _Var1;
  pointer this_00;
  _Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false> local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  Value local_60 [64];
  
  duckdb::LogicalType::LogicalType((LogicalType *)this,INTEGER);
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"BOUNDED","");
  duckdb::LogicalType::SetAlias(this,local_80);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  local_88._M_head_impl = (ExtensionTypeInfo *)operator_new(0x50);
  (((_Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
   &(local_88._M_head_impl)->modifiers)->_M_impl).super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  ((local_88._M_head_impl)->properties)._M_h._M_buckets = (__buckets_ptr)0x0;
  ((local_88._M_head_impl)->properties)._M_h._M_bucket_count = 0;
  ((local_88._M_head_impl)->properties)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((local_88._M_head_impl)->properties)._M_h._M_element_count = 0;
  *(undefined8 *)&((local_88._M_head_impl)->properties)._M_h._M_rehash_policy = 0;
  (((_Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
   &(local_88._M_head_impl)->modifiers)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
  (((_Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
   &(local_88._M_head_impl)->modifiers)->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_88._M_head_impl)->properties)._M_h._M_buckets =
       &((local_88._M_head_impl)->properties)._M_h._M_single_bucket;
  ((local_88._M_head_impl)->properties)._M_h._M_bucket_count = 1;
  ((local_88._M_head_impl)->properties)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((local_88._M_head_impl)->properties)._M_h._M_element_count = 0;
  ((local_88._M_head_impl)->properties)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((local_88._M_head_impl)->properties)._M_h._M_rehash_policy._M_next_resize = 0;
  ((local_88._M_head_impl)->properties)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = duckdb::
            unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
            ::operator->((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
                          *)&local_88);
  duckdb::Value::INTEGER((int)local_60);
  std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::
  emplace_back<duckdb::Value>
            ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
             this_00,local_60);
  duckdb::Value::~Value(local_60);
  _Var1._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (ExtensionTypeInfo *)0x0;
  duckdb::LogicalType::SetExtensionInfo(this);
  if (_Var1._M_head_impl != (ExtensionTypeInfo *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&((_Var1._M_head_impl)->properties)._M_h);
    std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::~vector
              ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
               _Var1._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  _Var1._M_head_impl = local_88._M_head_impl;
  if (local_88._M_head_impl != (ExtensionTypeInfo *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&((local_88._M_head_impl)->properties)._M_h);
    std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::~vector
              ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
               _Var1._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  return this;
}

Assistant:

static LogicalType Get(int32_t max_val) {
		auto type = LogicalType(LogicalTypeId::INTEGER);
		type.SetAlias("BOUNDED");
		auto info = make_uniq<ExtensionTypeInfo>();
		info->modifiers.emplace_back(Value::INTEGER(max_val));
		type.SetExtensionInfo(std::move(info));
		return type;
	}